

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultMpeg4Gif(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  self_type *psVar2;
  optional<int> oVar3;
  int iVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Ptr PVar6;
  path_type local_78;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::InlineQueryResultMpeg4Gif,std::allocator<TgBot::InlineQueryResultMpeg4Gif>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (InlineQueryResultMpeg4Gif **)this,
             (allocator<TgBot::InlineQueryResultMpeg4Gif> *)&local_78);
  paVar1 = &local_78.m_value.field_2;
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mpeg4_url","");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_78);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_48,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar2);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xa8),(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mpeg4_width","");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_78);
  iVar4 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar4 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 200) = iVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mpeg4_height","");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_78);
  iVar4 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar4 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xcc) = iVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mpeg4_duration","");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_78);
  iVar4 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar4 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xd0) = iVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"thumb_url","");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_78);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_48,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar2);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xd8),(string *)local_48);
  _Var5._M_pi = extraout_RDX;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
    _Var5._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_01;
  }
  PVar6.super___shared_ptr<TgBot::InlineQueryResultMpeg4Gif,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var5._M_pi;
  PVar6.super___shared_ptr<TgBot::InlineQueryResultMpeg4Gif,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar6.super___shared_ptr<TgBot::InlineQueryResultMpeg4Gif,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

InlineQueryResultMpeg4Gif::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultMpeg4Gif(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultMpeg4Gif>());
    result->mpeg4Url = data.get<string>("mpeg4_url");
    result->mpeg4Width = data.get("mpeg4_width", 0);
    result->mpeg4Height = data.get("mpeg4_height", 0);
    result->mpeg4Duration = data.get("mpeg4_duration", 0);
    result->thumbUrl = data.get<string>("thumb_url");
    return result;
}